

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_PlaneEquation * ON_PlaneEquation::CreateFromPointAndNormal(ON_3dPoint point,ON_3dVector normal)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ON_PlaneEquation *in_RDI;
  double dVar4;
  ON_3dVector N;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  ON_3dVector local_48;
  double local_28;
  undefined8 uStack_20;
  
  bVar3 = ON_3dPoint::IsValid((ON_3dPoint *)&N.y);
  if (!bVar3) goto LAB_0058893e;
  bVar3 = ON_3dVector::IsValid((ON_3dVector *)&stack0x00000020);
  if (!bVar3) goto LAB_0058893e;
  local_48.z = in_stack_00000030;
  local_48.x = in_stack_00000020;
  local_48.y = in_stack_00000028;
  ON_3dVector::Unitize(&local_48);
  bVar3 = ON_3dVector::IsUnitVector((ON_3dVector *)&stack0x00000020);
  if (bVar3) {
    dVar4 = ON_3dVector::Length(&local_48);
    local_28 = ABS(1.0 - dVar4);
    uStack_20 = 0;
    dVar4 = ON_3dVector::Length((ON_3dVector *)&stack0x00000020);
    if (local_28 < ABS(1.0 - dVar4) * 0.9999999997671694) goto LAB_005888d3;
  }
  else {
LAB_005888d3:
    in_stack_00000030 = local_48.z;
    in_stack_00000020 = local_48.x;
    in_stack_00000028 = local_48.y;
  }
  bVar3 = ON_3dVector::IsUnitVector((ON_3dVector *)&stack0x00000020);
  if (bVar3) {
    ON_PlaneEquation(in_RDI);
    in_RDI->x = in_stack_00000020;
    in_RDI->y = in_stack_00000028;
    in_RDI->z = in_stack_00000030;
    in_RDI->d = -(in_stack_00000030 * in_stack_00000018 +
                 in_stack_00000020 * N.y + in_stack_00000028 * N.z);
    return in_RDI;
  }
LAB_0058893e:
  dVar2 = NanPlaneEquation.d;
  dVar1 = NanPlaneEquation.y;
  dVar4 = NanPlaneEquation.x;
  in_RDI->z = NanPlaneEquation.z;
  in_RDI->d = dVar2;
  in_RDI->x = dVar4;
  in_RDI->y = dVar1;
  return in_RDI;
}

Assistant:

const ON_PlaneEquation ON_PlaneEquation::CreateFromPointAndNormal(
  ON_3dPoint point,
  ON_3dVector normal
)
{
  if (point.IsValid() && normal.IsValid())
  {
    const ON_3dVector N = normal.UnitVector();
    if (false == normal.IsUnitVector() || fabs(1.0 - N.Length()) < fabs(1.0 - normal.Length()) * (1.0 - ON_ZERO_TOLERANCE))
      normal = N; // N is a better unit vector
    if (normal.IsUnitVector())
    {
      ON_PlaneEquation e;
      e.x = normal.x;
      e.y = normal.y;
      e.z = normal.z;
      e.d = -(e.x * point.x + e.y * point.y + e.z * point.z);
      return e;
    }
  }
  return ON_PlaneEquation::NanPlaneEquation;
}